

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteQuotedData(WatWriter *this,void *data,size_t length)

{
  byte c_00;
  ulong uStack_30;
  uint8_t c;
  size_t i;
  uint8_t *u8_data;
  size_t length_local;
  void *data_local;
  WatWriter *this_local;
  
  WriteNextChar(this);
  WritePutc(this,'\"');
  for (uStack_30 = 0; uStack_30 < length; uStack_30 = uStack_30 + 1) {
    c_00 = *(byte *)((long)data + uStack_30);
    if ((anonymous_namespace)::s_is_char_escaped[c_00] == '\0') {
      WritePutc(this,c_00);
    }
    else {
      WritePutc(this,'\\');
      WritePutc(this,"0123456789abcdef"[(int)(uint)c_00 >> 4]);
      WritePutc(this,"0123456789abcdef"[(int)(c_00 & 0xf)]);
    }
  }
  WritePutc(this,'\"');
  this->next_char_ = Space;
  return;
}

Assistant:

void WatWriter::WriteQuotedData(const void* data, size_t length) {
  const uint8_t* u8_data = static_cast<const uint8_t*>(data);
  static const char s_hexdigits[] = "0123456789abcdef";
  WriteNextChar();
  WritePutc('\"');
  for (size_t i = 0; i < length; ++i) {
    uint8_t c = u8_data[i];
    if (s_is_char_escaped[c]) {
      WritePutc('\\');
      WritePutc(s_hexdigits[c >> 4]);
      WritePutc(s_hexdigits[c & 0xf]);
    } else {
      WritePutc(c);
    }
  }
  WritePutc('\"');
  next_char_ = NextChar::Space;
}